

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imglsadf.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  undefined1 uVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ostream *this;
  size_t sVar6;
  string *input_stream;
  long lVar7;
  undefined1 uVar8;
  char *__s_00;
  int interpolation_period;
  int frame_period;
  int num_stage;
  int num_filter_order;
  int num_pade_order;
  double alpha;
  double signal;
  ifstream ifs1;
  vector<double,_std::allocator<double>_> filter_coefficients;
  Buffer buffer;
  InputSourcePreprocessingForMelCepstrum preprocessing;
  ifstream ifs2;
  ostringstream error_message_10;
  InputSourceFromStream input_source;
  InverseMglsaDigitalFilter filter;
  InputSourceInterpolation interpolation;
  int local_848;
  int local_844;
  int local_840;
  int local_83c;
  int local_838;
  undefined4 local_834;
  string local_830;
  double local_810;
  double local_808;
  double local_800;
  double local_7f8;
  string local_7f0;
  byte abStack_7d0 [80];
  ios_base local_780 [408];
  vector<double,_std::allocator<double>_> local_5e8;
  undefined1 local_5d0 [32];
  pointer pdStack_5b0;
  pointer local_5a8;
  pointer pdStack_5a0;
  undefined **local_598;
  pointer local_590;
  pointer pdStack_588;
  pointer local_580;
  pointer pdStack_578;
  pointer local_570;
  pointer pdStack_568;
  pointer local_560;
  pointer pdStack_558;
  pointer local_550;
  pointer pdStack_548;
  pointer local_540;
  pointer pdStack_538;
  InputSourceInterface local_530;
  double local_528;
  undefined1 local_520;
  InputSourceFromStream *local_518;
  MelCepstrumToMlsaDigitalFilterCoefficients local_510;
  GeneralizedCepstrumGainNormalization local_4f0;
  undefined1 local_4d0;
  void *local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  string local_4b0;
  byte abStack_490 [80];
  ios_base local_440 [408];
  string local_2a8 [3];
  ios_base local_238 [264];
  InputSourceFromStream local_130;
  InverseMglsaDigitalFilter local_110;
  InputSourceInterpolation local_b0;
  
  local_83c = 0x19;
  local_810 = 0.35;
  local_840 = 0;
  local_844 = 100;
  local_848 = 1;
  local_838 = 4;
  local_834 = 0;
  uVar1 = 1;
switchD_001038ae_caseD_6b:
  uVar8 = uVar1;
  iVar5 = ya_getopt_long(argc,argv,"m:a:c:p:i:P:tkh",(option *)0x0,(int *)0x0);
  if (iVar5 - 0x61U < 0x14) {
    uVar1 = 0;
    switch(iVar5) {
    case 0x61:
      std::__cxx11::string::string((string *)&local_7f0,ya_optarg,(allocator *)&local_4b0);
      bVar2 = sptk::ConvertStringToDouble(&local_7f0,&local_810);
      if (bVar2) {
        bVar2 = sptk::IsValidAlpha(local_810);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
          operator_delete(local_7f0._M_dataplus._M_p);
        }
        uVar1 = uVar8;
        if (bVar2) goto switchD_001038ae_caseD_6b;
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
        operator_delete(local_7f0._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7f0,"The argument for the -a option must be in (-1.0, 1.0)",0x35)
      ;
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"imglsadf","");
      sptk::PrintErrorMessage(&local_4b0,(ostringstream *)&local_7f0);
      break;
    default:
      goto switchD_001038ae_caseD_62;
    case 99:
      std::__cxx11::string::string((string *)&local_7f0,ya_optarg,(allocator *)&local_4b0);
      bVar2 = sptk::ConvertStringToInteger(&local_7f0,&local_840);
      bVar3 = -1 < local_840;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
        operator_delete(local_7f0._M_dataplus._M_p);
      }
      uVar1 = uVar8;
      if (bVar2 && bVar3) goto switchD_001038ae_caseD_6b;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7f0,"The argument for the -c option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7f0,"non-negative integer",0x14);
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"imglsadf","");
      sptk::PrintErrorMessage(&local_4b0,(ostringstream *)&local_7f0);
      break;
    case 0x68:
      anon_unknown.dwarf_308a::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x69:
      std::__cxx11::string::string((string *)&local_7f0,ya_optarg,(allocator *)&local_4b0);
      bVar2 = sptk::ConvertStringToInteger(&local_7f0,&local_848);
      bVar3 = -1 < local_848;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
        operator_delete(local_7f0._M_dataplus._M_p);
      }
      uVar1 = uVar8;
      if (bVar2 && bVar3) goto switchD_001038ae_caseD_6b;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7f0,"The argument for the -i option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7f0,"non-negative integer",0x14);
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"imglsadf","");
      sptk::PrintErrorMessage(&local_4b0,(ostringstream *)&local_7f0);
      break;
    case 0x6b:
      goto switchD_001038ae_caseD_6b;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_7f0,ya_optarg,(allocator *)&local_4b0);
      bVar2 = sptk::ConvertStringToInteger(&local_7f0,&local_83c);
      bVar3 = -1 < local_83c;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
        operator_delete(local_7f0._M_dataplus._M_p);
      }
      uVar1 = uVar8;
      if (bVar2 && bVar3) goto switchD_001038ae_caseD_6b;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7f0,"The argument for the -m option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7f0,"non-negative integer",0x14);
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"imglsadf","");
      sptk::PrintErrorMessage(&local_4b0,(ostringstream *)&local_7f0);
      break;
    case 0x70:
      std::__cxx11::string::string((string *)&local_7f0,ya_optarg,(allocator *)&local_4b0);
      bVar3 = sptk::ConvertStringToInteger(&local_7f0,&local_844);
      bVar2 = 0 < local_844;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
        operator_delete(local_7f0._M_dataplus._M_p);
      }
      uVar1 = uVar8;
      if (bVar3 && bVar2) goto switchD_001038ae_caseD_6b;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7f0,"The argument for the -p option must be a positive integer",
                 0x39);
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"imglsadf","");
      sptk::PrintErrorMessage(&local_4b0,(ostringstream *)&local_7f0);
      break;
    case 0x74:
      local_834 = (undefined4)
                  CONCAT71((int7)((ulong)((long)&switchD_001038ae::switchdataD_0010d018 +
                                         (long)(int)(&switchD_001038ae::switchdataD_0010d018)
                                                    [iVar5 - 0x61U]) >> 8),1);
      uVar1 = uVar8;
      goto switchD_001038ae_caseD_6b;
    }
  }
  else if (iVar5 == 0x50) {
    std::__cxx11::string::string((string *)&local_7f0,ya_optarg,(allocator *)&local_4b0);
    bVar2 = sptk::ConvertStringToInteger(&local_7f0,&local_838);
    if (bVar2) {
      bVar2 = sptk::IsInRange(local_838,4,7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
        operator_delete(local_7f0._M_dataplus._M_p);
      }
      uVar1 = uVar8;
      if (bVar2) goto switchD_001038ae_caseD_6b;
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
      operator_delete(local_7f0._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7f0,"The argument for the -P option must be an integer ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7f0,"in the range of ",0x10);
    this = (ostream *)std::ostream::operator<<((ostream *)&local_7f0,4);
    std::__ostream_insert<char,std::char_traits<char>>(this," to ",4);
    std::ostream::operator<<((ostream *)this,7);
    local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"imglsadf","");
    sptk::PrintErrorMessage(&local_4b0,(ostringstream *)&local_7f0);
  }
  else {
    if (iVar5 != -1) goto switchD_001038ae_caseD_62;
    if (local_844 / 2 < local_848) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7f0,"Interpolation period must be equal to or less than half ",
                 0x38);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7f0,"frame period",0xc);
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"imglsadf","");
      sptk::PrintErrorMessage(&local_4b0,(ostringstream *)&local_7f0);
      goto LAB_00103ec5;
    }
    if (argc - ya_optind == 1) {
      lVar7 = (long)argc + -1;
      __s_00 = (char *)0x0;
    }
    else {
      if (argc - ya_optind != 2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_7f0,"Just two input files, mgcfile and infile, are required",
                   0x36);
        local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"imglsadf","");
        sptk::PrintErrorMessage(&local_4b0,(ostringstream *)&local_7f0);
        goto LAB_00103ec5;
      }
      lVar7 = (long)argc + -2;
      __s_00 = argv[(long)argc + -1];
    }
    __s = argv[lVar7];
    bVar2 = sptk::SetBinaryMode();
    if (bVar2) {
      std::ifstream::ifstream(&local_7f0);
      std::ifstream::open((char *)&local_7f0,(_Ios_Openmode)__s);
      if ((abStack_7d0[*(long *)(local_7f0._M_dataplus._M_p + -0x18)] & 5) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_4b0,"Cannot open file ",0x11);
        if (__s == (char *)0x0) {
          std::ios::clear((int)&local_848 + (int)*(undefined8 *)(local_4b0._M_dataplus._M_p + -0x18)
                          + 0x398);
        }
        else {
          sVar6 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b0,__s,sVar6);
        }
        local_2a8[0]._M_dataplus._M_p = (pointer)&local_2a8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"imglsadf","");
        sptk::PrintErrorMessage(local_2a8,(ostringstream *)&local_4b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8[0]._M_dataplus._M_p != &local_2a8[0].field_2) {
          operator_delete(local_2a8[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4b0);
        std::ios_base::~ios_base(local_440);
        iVar5 = 1;
        goto LAB_0010478e;
      }
      input_stream = &local_4b0;
      std::ifstream::ifstream(input_stream);
      if ((__s_00 != (char *)0x0) &&
         (std::ifstream::open((char *)&local_4b0,(_Ios_Openmode)__s_00),
         (abStack_490[*(long *)(local_4b0._M_dataplus._M_p + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a8,"Cannot open file ",0x11);
        sVar6 = strlen(__s_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,__s_00,sVar6);
        local_5d0._0_8_ = local_5d0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,"imglsadf","");
        sptk::PrintErrorMessage((string *)local_5d0,(ostringstream *)local_2a8);
        if ((undefined1 *)local_5d0._0_8_ != local_5d0 + 0x10) {
          operator_delete((void *)local_5d0._0_8_);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
        std::ios_base::~ios_base(local_238);
        iVar5 = 1;
        goto LAB_00104781;
      }
      cVar4 = std::__basic_file<char>::is_open();
      if (cVar4 == '\0') {
        input_stream = (string *)&std::cin;
      }
      lVar7 = (long)local_83c;
      _GLOBAL__N_1::std::vector<double,_std::allocator<double>_>::vector
                (&local_5e8,lVar7 + 1U,(allocator_type *)local_2a8);
      sptk::InputSourceFromStream::InputSourceFromStream
                (&local_130,false,(int)(lVar7 + 1U),(istream *)&local_7f0);
      local_808 = 0.0;
      if (local_840 != 0) {
        local_808 = -1.0 / (double)local_840;
      }
      local_800 = local_810;
      local_530._vptr_InputSourceInterface =
           (_func_int **)&PTR__InputSourcePreprocessingForMelCepstrum_00112ad8;
      local_528 = local_808;
      local_520 = uVar8;
      local_518 = &local_130;
      iVar5 = (*local_130.super_InputSourceInterface._vptr_InputSourceInterface[2])(&local_130);
      sptk::MelCepstrumToMlsaDigitalFilterCoefficients::MelCepstrumToMlsaDigitalFilterCoefficients
                (&local_510,iVar5 + -1,local_800);
      iVar5 = (*local_130.super_InputSourceInterface._vptr_InputSourceInterface[2])();
      sptk::GeneralizedCepstrumGainNormalization::GeneralizedCepstrumGainNormalization
                (&local_4f0,iVar5 + -1,local_808);
      local_4d0 = 1;
      local_4c8 = (void *)0x0;
      uStack_4c0 = 0;
      local_4b8 = 0;
      iVar5 = (*local_130.super_InputSourceInterface._vptr_InputSourceInterface[3])();
      if ((((char)iVar5 == '\0') || (local_510.is_valid_ != true)) || (local_4f0.is_valid_ == false)
         ) {
        local_4d0 = 0;
      }
      sptk::InputSourceInterpolation::InputSourceInterpolation
                (&local_b0,local_844,local_848,true,&local_530);
      if (local_b0.is_valid_ != false) {
        sptk::InverseMglsaDigitalFilter::InverseMglsaDigitalFilter
                  (&local_110,local_83c,local_838,local_840,local_810,(bool)((byte)local_834 & 1));
        local_5d0._0_8_ = &PTR__Buffer_00112b38;
        local_5d0._8_8_ = (pointer)0x0;
        local_5d0._16_8_ = 0;
        local_5d0._24_8_ = 0;
        pdStack_5b0 = (pointer)0x0;
        local_5a8 = (pointer)0x0;
        pdStack_5a0 = (pointer)0x0;
        local_598 = &PTR__Buffer_00112b68;
        local_590 = (pointer)0x0;
        pdStack_588 = (pointer)0x0;
        local_580 = (pointer)0x0;
        pdStack_578 = (pointer)0x0;
        local_570 = (pointer)0x0;
        pdStack_568 = (pointer)0x0;
        local_560 = (pointer)0x0;
        pdStack_558 = (pointer)0x0;
        local_550 = (pointer)0x0;
        pdStack_548 = (pointer)0x0;
        local_540 = (pointer)0x0;
        pdStack_538 = (pointer)0x0;
        if (local_110.is_valid_ == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a8,"Failed to initialize InverseMglsaDigitalFilter",0x2e);
          local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"imglsadf","");
          sptk::PrintErrorMessage(&local_830,(ostringstream *)local_2a8);
          goto LAB_001046cf;
        }
        goto LAB_00104464;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a8,"Failed to initialize InputSource",0x20);
      local_5d0._0_8_ = local_5d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,"imglsadf","");
      sptk::PrintErrorMessage((string *)local_5d0,(ostringstream *)local_2a8);
      if ((undefined1 *)local_5d0._0_8_ != local_5d0 + 0x10) {
        operator_delete((void *)local_5d0._0_8_);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
      std::ios_base::~ios_base(local_238);
      iVar5 = 1;
      goto LAB_00104741;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7f0,"Cannot set translation mode",0x1b);
    local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"imglsadf","");
    sptk::PrintErrorMessage(&local_4b0,(ostringstream *)&local_7f0);
  }
LAB_00103ec5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_7f0);
  std::ios_base::~ios_base(local_780);
  return 1;
switchD_001038ae_caseD_62:
  anon_unknown.dwarf_308a::PrintUsage((ostream *)&std::cerr);
  return 1;
  while( true ) {
    bVar2 = sptk::InverseMglsaDigitalFilter::Run
                      (&local_110,&local_5e8,&local_7f8,(Buffer *)local_5d0);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a8,"Failed to apply inverse MGLSA digital filter",0x2c);
      local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"imglsadf","");
      sptk::PrintErrorMessage(&local_830,(ostringstream *)local_2a8);
      goto LAB_001046cf;
    }
    bVar2 = sptk::WriteStream<double>(local_7f8,(ostream *)&std::cout);
    if (!bVar2) break;
LAB_00104464:
    bVar2 = sptk::ReadStream<double>(&local_7f8,(istream *)input_stream);
    if (!bVar2) {
      iVar5 = 0;
      goto LAB_00104704;
    }
    bVar2 = sptk::InputSourceInterpolation::Get
                      (&local_b0,(vector<double,_std::allocator<double>_> *)&local_5e8);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a8,"Cannot get filter coefficients",0x1e);
      local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"imglsadf","");
      sptk::PrintErrorMessage(&local_830,(ostringstream *)local_2a8);
      goto LAB_001046cf;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a8,"Failed to write a filter output",0x1f);
  local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"imglsadf","");
  sptk::PrintErrorMessage(&local_830,(ostringstream *)local_2a8);
LAB_001046cf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830._M_dataplus._M_p != &local_830.field_2) {
    operator_delete(local_830._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
  std::ios_base::~ios_base(local_238);
  iVar5 = 1;
LAB_00104704:
  sptk::InverseMglsaDigitalFilter::Buffer::~Buffer((Buffer *)local_5d0);
  local_110._vptr_InverseMglsaDigitalFilter = (_func_int **)&PTR__InverseMglsaDigitalFilter_00112b98
  ;
  local_110.mlsa_digital_filter_._vptr_MlsaDigitalFilter =
       (_func_int **)&PTR__MlsaDigitalFilter_00112bc8;
  if (local_110.mlsa_digital_filter_.pade_coefficients_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_110.mlsa_digital_filter_.pade_coefficients_.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00104741:
  sptk::InputSourceInterpolation::~InputSourceInterpolation(&local_b0);
  local_530._vptr_InputSourceInterface =
       (_func_int **)&PTR__InputSourcePreprocessingForMelCepstrum_00112ad8;
  if (local_4c8 != (void *)0x0) {
    operator_delete(local_4c8);
  }
  if (local_5e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_5e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00104781:
  std::ifstream::~ifstream(&local_4b0);
LAB_0010478e:
  std::ifstream::~ifstream(&local_7f0);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_filter_order(kDefaultNumFilterOrder);
  double alpha(kDefaultAlpha);
  int num_stage(kDefaultNumStage);
  int frame_period(kDefaultFramePeriod);
  int interpolation_period(kDefaultInterpolationPeriod);
  int num_pade_order(kDefaultNumPadeOrder);
  bool transposition_flag(kDefaultTranspositionFlag);
  bool gain_flag(kDefaultGainFlag);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "m:a:c:p:i:P:tkh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_filter_order) ||
            num_filter_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &alpha) ||
            !sptk::IsValidAlpha(alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToInteger(optarg, &num_stage) ||
            num_stage < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -c option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_period) ||
            frame_period <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &interpolation_period) ||
            interpolation_period < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 'P': {
        const int min(4);
        const int max(7);
        if (!sptk::ConvertStringToInteger(optarg, &num_pade_order) ||
            !sptk::IsInRange(num_pade_order, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -P option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 't': {
        transposition_flag = true;
        break;
      }
      case 'k': {
        gain_flag = false;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (frame_period / 2 < interpolation_period) {
    std::ostringstream error_message;
    error_message << "Interpolation period must be equal to or less than half "
                  << "frame period";
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }

  // Get input file names.
  const char* filter_coefficients_file;
  const char* filter_input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    filter_coefficients_file = argv[argc - 2];
    filter_input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    filter_coefficients_file = argv[argc - 1];
    filter_input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, mgcfile and infile, are required";
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }

  // Open stream for reading filter coefficients.
  std::ifstream ifs1;
  ifs1.open(filter_coefficients_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << filter_coefficients_file;
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }
  std::istream& stream_for_filter_coefficients(ifs1);

  // Open stream for reading input signals.
  std::ifstream ifs2;
  if (NULL != filter_input_file) {
    ifs2.open(filter_input_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << filter_input_file;
      sptk::PrintErrorMessage("imglsadf", error_message);
      return 1;
    }
  }
  std::istream& stream_for_filter_input(ifs2.is_open() ? ifs2 : std::cin);

  // Prepare variables for filtering.
  const int filter_length(num_filter_order + 1);
  std::vector<double> filter_coefficients(filter_length);
  sptk::InputSourceFromStream input_source(false, filter_length,
                                           &stream_for_filter_coefficients);
  const double gamma((0 == num_stage) ? 0.0 : -1.0 / num_stage);
  InputSourcePreprocessingForMelCepstrum preprocessing(alpha, gamma, gain_flag,
                                                       &input_source);
  sptk::InputSourceInterpolation interpolation(
      frame_period, interpolation_period, true, &preprocessing);
  if (!interpolation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSource";
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }

  sptk::InverseMglsaDigitalFilter filter(num_filter_order, num_pade_order,
                                         num_stage, alpha, transposition_flag);
  sptk::InverseMglsaDigitalFilter::Buffer buffer;
  if (!filter.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InverseMglsaDigitalFilter";
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }

  double signal;

  while (sptk::ReadStream(&signal, &stream_for_filter_input)) {
    if (!interpolation.Get(&filter_coefficients)) {
      std::ostringstream error_message;
      error_message << "Cannot get filter coefficients";
      sptk::PrintErrorMessage("imglsadf", error_message);
      return 1;
    }

    if (!filter.Run(filter_coefficients, &signal, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to apply inverse MGLSA digital filter";
      sptk::PrintErrorMessage("imglsadf", error_message);
      return 1;
    }

    if (!sptk::WriteStream(signal, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write a filter output";
      sptk::PrintErrorMessage("imglsadf", error_message);
      return 1;
    }
  }

  return 0;
}